

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::DOMElementImpl::isEqualNode(DOMElementImpl *this,DOMNode *arg)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x1b])();
  bVar1 = true;
  if ((char)iVar3 == '\0') {
    bVar1 = DOMNodeImpl::isEqualNode(&this->fNode,arg);
    if (bVar1) {
      iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x1a])(this);
      iVar4 = (*arg->_vptr_DOMNode[0x1a])(arg);
      if ((char)iVar3 == (char)iVar4) {
        if ((char)iVar3 == '\0') {
LAB_0026b4bd:
          bVar1 = DOMParentNode::isEqualNode(&this->fParent,arg);
          return bVar1;
        }
        iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xb])(this);
        plVar5 = (long *)CONCAT44(extraout_var,iVar3);
        iVar3 = (*arg->_vptr_DOMNode[0xb])(arg);
        plVar6 = (long *)CONCAT44(extraout_var_00,iVar3);
        lVar7 = (**(code **)(*plVar5 + 0x28))(plVar5);
        lVar8 = (**(code **)(*plVar6 + 0x28))(plVar6);
        if (lVar7 == lVar8) {
          if (lVar7 != 0) {
            lVar8 = 0;
            do {
              plVar9 = (long *)(**(code **)(*plVar5 + 0x18))(plVar5,lVar8);
              lVar10 = (**(code **)(*plVar9 + 0xc0))(plVar9);
              if (lVar10 == 0) {
                uVar11 = (**(code **)(*plVar9 + 0x10))(plVar9);
                lVar10 = (**(code **)(*plVar6 + 0x20))(plVar6,uVar11);
              }
              else {
                uVar11 = (**(code **)(*plVar9 + 0xb0))();
                uVar12 = (**(code **)(*plVar9 + 0xc0))(plVar9);
                lVar10 = (**(code **)(*plVar6 + 0x38))(plVar6,uVar11,uVar12);
              }
              if (lVar10 == 0) goto LAB_0026b3ce;
              cVar2 = (**(code **)(*plVar9 + 0xe0))(plVar9,lVar10);
              if (cVar2 == '\0') goto LAB_0026b3ce;
              lVar8 = lVar8 + 1;
            } while (lVar7 != lVar8);
          }
          goto LAB_0026b4bd;
        }
      }
    }
LAB_0026b3ce:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DOMElementImpl::isEqualNode(const DOMNode* arg) const
{
    if (isSameNode(arg)) {
        return true;
    }

    if (!fNode.isEqualNode(arg)) {
        return false;
    }

    bool hasAttrs = hasAttributes();

    if (hasAttrs != arg->hasAttributes()) {
        return false;
    }

    if (hasAttrs) {
        DOMNamedNodeMap* map1 = getAttributes();
        DOMNamedNodeMap* map2 = arg->getAttributes();

        XMLSize_t len = map1->getLength();
        if (len != map2->getLength()) {
            return false;
        }
        for (XMLSize_t i = 0; i < len; i++) {
            DOMNode* n1 = map1->item(i);
            if (!n1->getLocalName()) { // DOM Level 1 Node
                DOMNode* n2 = map2->getNamedItem(n1->getNodeName());
                if (!n2 || !n1->isEqualNode(n2)) {
                    return false;
                }
            }
            else {
                DOMNode* n2 = map2->getNamedItemNS(n1->getNamespaceURI(),
                                              n1->getLocalName());
                if (!n2 || !n1->isEqualNode(n2)) {
                    return false;
                }
            }
        }
    }

    return fParent.isEqualNode(arg);
}